

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O1

LispPTR get_package_atom(char *char_base,DLword charlen,char *packname,DLword packlen,int externalp)

{
  DLword *pDVar1;
  int iVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  undefined6 in_register_0000000a;
  uint len;
  char *packname_00;
  ulong __n;
  
  __n = CONCAT62(in_register_0000000a,packlen) & 0xffffffff;
  iVar2 = strncmp(packname,"XCL",__n);
  if (iVar2 == 0) {
    packname_00 = "XEROX-COMMON-LISP";
    len = 0x11;
  }
  else {
    iVar2 = strncmp(packname,"SI",__n);
    if (iVar2 == 0) {
      packname_00 = "SYSTEM";
      len = 6;
    }
    else {
      iVar2 = strncmp(packname,"CL",__n);
      if (iVar2 == 0) {
        packname_00 = "LISP";
        len = 4;
      }
      else {
        iVar2 = strncmp(packname,"XCLC",__n);
        if (iVar2 == 0) {
          packname_00 = "COMPILER";
          len = 8;
        }
        else {
          len = (uint)packlen;
          packname_00 = packname;
        }
      }
    }
  }
  iVar2 = find_package_from_name(packname_00,len);
  if (iVar2 < 0) {
    printf("getting package index failed %s:%s\n",packname,char_base);
    LVar4 = 0xffffffff;
  }
  else {
    LVar3 = aref1(*Package_from_Index_word,iVar2);
    if ((LVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    pDVar1 = Lisp_world;
    LVar4 = find_symbol(char_base,0,charlen,*(LispPTR *)(Lisp_world + (ulong)LVar3 + 0x12),0,0);
    if (LVar4 == 0xffffffff) {
      LVar4 = find_symbol(char_base,0,charlen,*(LispPTR *)(pDVar1 + (ulong)LVar3 + 0x10),0,0);
      return LVar4;
    }
  }
  return LVar4;
}

Assistant:

LispPTR get_package_atom(const char *char_base, DLword charlen, const char *packname, DLword packlen,
                         int externalp) {
  int packindex;
  PACKAGE *packaddr;
  /* LispPTR hashtbladdr; */
  LispPTR index;

  /* For convenience, recognize the common package nicknames: */

  if (0 == strncmp(packname, "XCL", packlen))
    packindex = find_package_from_name("XEROX-COMMON-LISP", 17);
  else if (0 == strncmp(packname, "SI", packlen))
    packindex = find_package_from_name("SYSTEM", 6);
  else if (0 == strncmp(packname, "CL", packlen))
    packindex = find_package_from_name("LISP", 4);
  else if (0 == strncmp(packname, "XCLC", packlen))
    packindex = find_package_from_name("COMPILER", 8);

  /**** else if (0 == strncmp(packname, "KEYWORD", packlen))
      packindex = 7;***/

  else
    packindex = find_package_from_name(packname, packlen);

  if (packindex < 0) {
    printf("getting package index failed %s:%s\n", packname, char_base);
    return (0xffffffff);
  }

  /* if (packindex != 7)  Not necessary (Take)*/
  packaddr = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, packindex));
  /* else packaddr = (PACKAGE *)NativeAligned4FromLAddr(
                          *Keyword_Package_word);	*/
  /* hashtbladdr =	((externalp == T)?(packaddr->EXTERNAL_SYMBOLS):
                           (packaddr->INTERNAL_SYMBOLS));
   return( find_symbol(char_base, 0, charlen, hashtbladdr, 0, 0) );*/

  if ((index = find_symbol(char_base, 0, charlen, packaddr->EXTERNAL_SYMBOLS, 0, 0)) != 0xffffffff)
    return (index);
  else
    return (find_symbol(char_base, 0, charlen, packaddr->INTERNAL_SYMBOLS, 0, 0));
}